

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O1

int Maj_ManMarkup(Maj_Man_t *p)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  int (*paaiVar5) [3] [32];
  int (*paaiVar6) [3] [32];
  int *piVar7;
  long lVar8;
  
  p->iVar = 1;
  if (0x20 < p->nObjs) {
    __assert_fail("p->nObjs <= MAJ_NOBJS",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                  ,0x5d,"int Maj_ManMarkup(Maj_Man_t *)");
  }
  piVar7 = p->VarMarks[p->nVars + 2][0] + 4;
  iVar3 = 4;
  lVar8 = 0;
  do {
    if (p->iVar < 0) {
LAB_0059fb7a:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    Vec_WecPush(p->vOutLits,iVar3,p->iVar * 2);
    iVar1 = p->iVar;
    p->iVar = iVar1 + 1;
    *piVar7 = iVar1;
    lVar8 = lVar8 + 1;
    piVar7 = piVar7 + 0x1f;
    iVar3 = iVar3 + -1;
  } while (lVar8 != 3);
  iVar3 = p->nVars;
  if (iVar3 + 3 < p->nObjs) {
    lVar8 = (long)iVar3 + 3;
    paaiVar5 = p->VarMarks + (long)iVar3 + 3;
    do {
      lVar4 = 0;
      paaiVar6 = paaiVar5;
      do {
        if ((lVar4 == 0) && (p->fUseLine != 0)) {
          if (p->iVar < 0) goto LAB_0059fb7a;
          Vec_WecPush(p->vOutLits,(int)lVar8 + -1,p->iVar * 2);
          iVar3 = p->iVar;
          p->iVar = iVar3 + 1;
          *(int *)((long)p->VarMarks + lVar8 * 0x184 + -4) = iVar3;
        }
        else {
          uVar2 = (ulong)((uint)(p->fUseConst == 0) * 2);
          if (lVar4 != 2) {
            uVar2 = 2;
          }
          for (; (long)uVar2 < lVar8 - lVar4; uVar2 = uVar2 + 1) {
            if (p->iVar < 0) goto LAB_0059fb7a;
            Vec_WecPush(p->vOutLits,(int)uVar2,p->iVar * 2);
            iVar3 = p->iVar;
            p->iVar = iVar3 + 1;
            (*paaiVar6)[0][uVar2] = iVar3;
          }
        }
        lVar4 = lVar4 + 1;
        paaiVar6 = (int (*) [3] [32])(*paaiVar6 + 1);
      } while (lVar4 != 3);
      lVar8 = lVar8 + 1;
      paaiVar5 = paaiVar5 + 1;
    } while (lVar8 < p->nObjs);
  }
  printf("The number of parameter variables = %d.\n",(ulong)(uint)p->iVar);
  return p->iVar;
}

Assistant:

int Maj_ManMarkup( Maj_Man_t * p )
{
    int i, k, j;
    p->iVar = 1;
    assert( p->nObjs <= MAJ_NOBJS );
    // make exception for the first node
    i = p->nVars + 2;
    for ( k = 0; k < 3; k++ )
    {
        j = 4-k;
        Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
        p->VarMarks[i][k][j] = p->iVar++;
    }
    // assign variables for other nodes
    for ( i = p->nVars + 3; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            if ( p->fUseLine && k == 0 )
            {
                j = i-1;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = (p->fUseConst && k == 2) ? 0 : 2; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 3; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}